

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Flip
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,bool horizontal,bool vertical)

{
  uchar *puVar1;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong __n;
  uchar *puVar7;
  ulong uVar8;
  uchar *puVar9;
  uint8_t *outY;
  uchar *puVar10;
  ulong uVar11;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  if (horizontal || vertical) {
    uVar3 = in->_rowSize;
    uVar6 = (ulong)uVar3;
    __n = (ulong)width;
    uVar4 = out->_rowSize;
    uVar11 = (ulong)uVar4;
    puVar9 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar3);
    puVar1 = puVar9 + uVar3 * height;
    if (horizontal && !vertical) {
      puVar10 = out->_data + (__n - 1) + (ulong)startXOut + (ulong)(startYOut * uVar4);
      for (; puVar9 != puVar1; puVar9 = puVar9 + uVar6) {
        puVar7 = puVar9;
        for (lVar5 = 0; -lVar5 != __n; lVar5 = lVar5 + -1) {
          uVar2 = *puVar7;
          puVar7 = puVar7 + 1;
          puVar10[lVar5] = uVar2;
        }
        puVar10 = puVar10 + uVar11;
      }
    }
    else {
      puVar10 = out->_data + (ulong)startXOut + (ulong)(((startYOut - 1) + height) * uVar4);
      if (vertical && !horizontal) {
        for (uVar8 = 0; uVar3 * height != uVar8; uVar8 = uVar8 + uVar6) {
          memcpy(puVar10,puVar9 + uVar8,__n);
          puVar10 = puVar10 + -uVar11;
        }
      }
      else {
        puVar10 = puVar10 + (__n - 1);
        for (; puVar9 != puVar1; puVar9 = puVar9 + uVar6) {
          puVar7 = puVar9;
          for (lVar5 = 0; -lVar5 != __n; lVar5 = lVar5 + -1) {
            uVar2 = *puVar7;
            puVar7 = puVar7 + 1;
            puVar10[lVar5] = uVar2;
          }
          puVar10 = puVar10 + -uVar11;
        }
      }
    }
  }
  else {
    Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  }
  return;
}

Assistant:

void Flip( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height, bool horizontal, bool vertical )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( !horizontal && !vertical ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const uint32_t rowSizeIn  = in.rowSize();
            const uint32_t rowSizeOut = out.rowSize();

            const uint8_t * inY    = in.data() + startYIn * rowSizeIn + startXIn;
            const uint8_t * inYEnd = inY + height * rowSizeIn;

            if( horizontal && !vertical ) {
                uint8_t * outY = out.data() + startYOut * rowSizeOut + startXOut + width - 1;

                for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
                    const uint8_t * inX    = inY;
                    uint8_t       * outX   = outY;
                    const uint8_t * inXEnd = inX + width;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
            else if( !horizontal && vertical ) {
                uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut;

                for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut )
                    memcpy( outY, inY, sizeof( uint8_t ) * width );
            }
            else {
                uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - 1;

                for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut ) {
                    const uint8_t * inX    = inY;
                    uint8_t       * outX   = outY;
                    const uint8_t * inXEnd = inX + width;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
    }